

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O3

complex_t __thiscall Iir::Cascade::response(Cascade *this,double normalizedFrequency)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  invalid_argument *this_00;
  uint uVar6;
  double *pdVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  complex_t cVar12;
  double local_98;
  undefined8 uStack_90;
  complex<double> local_88;
  complex<double> local_78;
  undefined1 local_68 [16];
  complex<double> local_58;
  complex<double> local_48;
  
  if (0.5 < normalizedFrequency) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"The normalised frequency needs to be =< 0.5.");
  }
  else {
    if (0.0 <= normalizedFrequency) {
      dVar2 = -(normalizedFrequency * 6.283185307179586);
      local_98 = cos(dVar2);
      dVar2 = sin(dVar2);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar2;
      local_68._12_4_ = extraout_XMM0_Dd;
      dVar2 = normalizedFrequency * 6.283185307179586 * -2.0;
      dVar3 = cos(dVar2);
      dVar2 = sin(dVar2);
      local_78._M_value._0_8_ = 0x3ff0000000000000;
      local_78._M_value._8_8_ = 0;
      local_88._M_value._0_8_ = 0x3ff0000000000000;
      local_88._M_value._8_8_ = 0;
      if (this->m_numStages < 1) {
        uVar8 = 0;
        uVar11 = 0;
        uVar10 = uVar8;
      }
      else {
        uStack_90._0_4_ = local_68._0_4_;
        uStack_90._4_4_ = local_68._4_4_;
        pdVar7 = &this->m_stageArray->m_b0;
        uVar6 = this->m_numStages + 1;
        do {
          dVar1 = ((Biquad *)(pdVar7 + -5))->m_a0;
          dVar4 = (pdVar7[-2] * dVar1) / dVar1;
          dVar9 = (pdVar7[-1] * dVar1) / dVar1;
          dVar5 = dVar9 * dVar2 + dVar4 * uStack_90 + 0.0;
          local_58._M_value._8_4_ = SUB84(dVar5,0);
          local_58._M_value._0_8_ = dVar9 * dVar3 + dVar4 * local_98 + (*pdVar7 * dVar1) / dVar1;
          local_58._M_value._12_4_ = (int)((ulong)dVar5 >> 0x20);
          dVar9 = (pdVar7[-4] * dVar1) / dVar1;
          dVar1 = (pdVar7[-3] * dVar1) / dVar1;
          dVar4 = dVar1 * dVar2 + dVar9 * uStack_90 + 0.0;
          local_48._M_value._8_4_ = SUB84(dVar4,0);
          local_48._M_value._0_8_ = dVar1 * dVar3 + dVar9 * local_98 + 1.0;
          local_48._M_value._12_4_ = (int)((ulong)dVar4 >> 0x20);
          std::complex<double>::operator*=(&local_78,&local_58);
          std::complex<double>::operator*=(&local_88,&local_48);
          pdVar7 = pdVar7 + 6;
          uVar6 = uVar6 - 1;
        } while (1 < uVar6);
        uVar8 = local_78._M_value._0_4_;
        uVar11 = local_88._M_value._8_4_;
        uVar10 = local_88._M_value._0_4_;
      }
      cVar12._M_value = (_ComplexT)__divdc3(uVar8,local_78._M_value._8_8_,uVar10,uVar11);
      return (complex_t)cVar12._M_value;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"The normalised frequency needs to be >= 0.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

complex_t Cascade::response (double normalizedFrequency) const
	{
		if (normalizedFrequency > 0.5) throw_invalid_argument(maxFError);
		if (normalizedFrequency < 0.0) throw_invalid_argument(minFError);
		double w = 2 * doublePi * normalizedFrequency;
		const complex_t czn1 = std::polar (1., -w);
		const complex_t czn2 = std::polar (1., -2 * w);
		complex_t ch (1);
		complex_t cbot (1);

		const Biquad* stage = m_stageArray;
		for (int i = m_numStages; --i >=0; ++stage)
		{
			complex_t cb (1);
			complex_t ct    (stage->getB0()/stage->getA0());
			ct = addmul (ct, stage->getB1()/stage->getA0(), czn1);
			ct = addmul (ct, stage->getB2()/stage->getA0(), czn2);
			cb = addmul (cb, stage->getA1()/stage->getA0(), czn1);
			cb = addmul (cb, stage->getA2()/stage->getA0(), czn2);
			ch   *= ct;
			cbot *= cb;
		}

		return ch / cbot;
	}